

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O0

void __thiscall dynamicgraph::SignalBase<int>::checkCompatibility(SignalBase<int> *this)

{
  ExceptionSignal *this_00;
  undefined8 uVar1;
  allocator<char> local_39;
  string local_38 [36];
  ErrorCodeEnum local_14;
  SignalBase<int> *local_10;
  SignalBase<int> *this_local;
  
  local_10 = this;
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_14 = PLUG_IMPOSSIBLE;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"Abstract signal not compatible with anything.",&local_39);
  getName_abi_cxx11_(this);
  uVar1 = std::__cxx11::string::c_str();
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_14,local_38,"(while trying to plug <%s>).",uVar1);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
}

Assistant:

virtual void checkCompatibility() {
    DG_THROW ExceptionSignal(ExceptionSignal::PLUG_IMPOSSIBLE,
                             "Abstract signal not compatible with anything.",
                             "(while trying to plug <%s>).",
                             this->getName().c_str());
  }